

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall
iu_AssertionTest_x_iutest_x_MATCHES_REGEXNE_Test::Body
          (iu_AssertionTest_x_iutest_x_MATCHES_REGEXNE_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionHelper local_7b8;
  Fixed local_788;
  undefined1 local_600 [8];
  AssertionResult iutest_ar_3;
  Fixed local_5a8;
  undefined1 local_420 [8];
  AssertionResult iutest_ar_2;
  Fixed local_3c8;
  undefined1 local_240 [8];
  AssertionResult iutest_ar_1;
  AssertionHelper local_210;
  Fixed local_1e0;
  undefined1 local_48 [8];
  AssertionResult iutest_ar;
  char test [10];
  iu_AssertionTest_x_iutest_x_MATCHES_REGEXNE_Test *this_local;
  
  iutest_ar.m_result = true;
  iutest_ar._33_7_ = 0x74733332313065;
  iutest::detail::AlwaysZero();
  iuutil::CmpHelperMatchesRegexNe
            ((AssertionResult *)local_48,"\"te[0-9]*st\"","test","te[0-9]*st",&iutest_ar.m_result);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    memset(&local_1e0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1e0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_48);
    iutest::AssertionHelper::AssertionHelper
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
               ,0x176,pcVar2,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_210,&local_1e0);
    iutest::AssertionHelper::~AssertionHelper(&local_210);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1e0);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (iutest_ar_1._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    iuutil::CmpHelperMatchesRegexNe
              ((AssertionResult *)local_240,"\"te[0-9]*st\"","test","te[0-9]*st",&iutest_ar.m_result
              );
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
    if (!bVar1) {
      memset(&local_3c8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3c8);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_240);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_2.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                 ,0x177,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_3c8);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3c8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_240);
    iutest::detail::AlwaysZero();
    iuutil::CmpHelperMatchesRegexNe
              ((AssertionResult *)local_420,"\"te[0-9]*st\"","test","te[0-9]*st",&iutest_ar.m_result
              );
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
    if (!bVar1) {
      memset(&local_5a8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_5a8);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_420);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_3.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                 ,0x178,pcVar2,kWarning);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_3.m_result,&local_5a8);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_3.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_5a8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_420);
    iutest::detail::AlwaysZero();
    iuutil::CmpHelperMatchesRegexNe
              ((AssertionResult *)local_600,"\"te[0-9]*st\"","test","te[0-9]*st",&iutest_ar.m_result
              );
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_600);
    if (!bVar1) {
      memset(&local_788,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_788);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_600);
      iutest::AssertionHelper::AssertionHelper
                (&local_7b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                 ,0x179,pcVar2,kAssumeFailure);
      iutest::AssertionHelper::operator=(&local_7b8,&local_788);
      iutest::AssertionHelper::~AssertionHelper(&local_7b8);
      iutest::AssertionHelper::Fixed::~Fixed(&local_788);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_600);
  }
  return;
}

Assistant:

IUTEST(AssertionTest, MATCHES_REGEXNE)
{
    const char test[] = "te0123sta";
    IUTEST_ASSERT_MATCHES_REGEXNE("te[0-9]*st", test);
    IUTEST_EXPECT_MATCHES_REGEXNE("te[0-9]*st", test);
    IUTEST_INFORM_MATCHES_REGEXNE("te[0-9]*st", test);
    IUTEST_ASSUME_MATCHES_REGEXNE("te[0-9]*st", test);
}